

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O0

void Diligent::anon_unknown_61::ValidateDepthStencilDesc
               (PipelineStateDesc *PSODesc,GraphicsPipelineDesc *GraphicsPipeline)

{
  long lVar1;
  PipelineStateDesc *local_50;
  undefined1 local_48 [8];
  anon_class_16_2_777d8791 CheckStencilOpDesc;
  char *local_30;
  DepthStencilStateDesc *local_28;
  DepthStencilStateDesc *DSSDesc;
  GraphicsPipelineDesc *GraphicsPipeline_local;
  PipelineStateDesc *PSODesc_local;
  
  local_28 = &GraphicsPipeline->DepthStencilDesc;
  DSSDesc = (DepthStencilStateDesc *)GraphicsPipeline;
  GraphicsPipeline_local = (GraphicsPipelineDesc *)PSODesc;
  if (((local_28->DepthEnable & 1U) != 0) &&
     ((GraphicsPipeline->DepthStencilDesc).DepthFunc == COMPARISON_FUNC_UNKNOWN)) {
    local_30 = GetPipelineTypeString(PSODesc->PipelineType);
    lVar1._0_1_ = (GraphicsPipeline_local->BlendDesc).AlphaToCoverageEnable;
    lVar1._1_1_ = (GraphicsPipeline_local->BlendDesc).IndependentBlendEnable;
    lVar1._2_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendEnable;
    lVar1._3_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].LogicOperationEnable;
    lVar1._4_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlend;
    lVar1._5_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlend;
    lVar1._6_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendOp;
    lVar1._7_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlendAlpha;
    if (lVar1 == 0) {
      local_50 = (PipelineStateDesc *)0xc361e0;
    }
    else {
      local_50 = *(PipelineStateDesc **)&GraphicsPipeline_local->BlendDesc;
    }
    CheckStencilOpDesc.PSODesc = local_50;
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[86]>
              (false,"ValidateDepthStencilDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x3c,(char (*) [16])"Description of ",&local_30,(char (*) [7])0xc0e54c,
               (char **)&CheckStencilOpDesc.PSODesc,(char (*) [15])"\' is invalid: ",
               (char (*) [86])
               "DepthStencilDesc.DepthFunc must not be COMPARISON_FUNC_UNKNOWN when depth is enabled."
              );
  }
  local_48 = (undefined1  [8])local_28;
  CheckStencilOpDesc.DSSDesc = (DepthStencilStateDesc *)GraphicsPipeline_local;
  ValidateDepthStencilDesc::anon_class_16_2_777d8791::operator()
            ((anon_class_16_2_777d8791 *)local_48,&local_28->FrontFace,"FrontFace");
  ValidateDepthStencilDesc::anon_class_16_2_777d8791::operator()
            ((anon_class_16_2_777d8791 *)local_48,&local_28->BackFace,"BackFace");
  return;
}

Assistant:

void ValidateDepthStencilDesc(const PipelineStateDesc& PSODesc, const GraphicsPipelineDesc& GraphicsPipeline) noexcept(false)
{
    const DepthStencilStateDesc& DSSDesc = GraphicsPipeline.DepthStencilDesc;
    if (DSSDesc.DepthEnable && DSSDesc.DepthFunc == COMPARISON_FUNC_UNKNOWN)
        LOG_PSO_ERROR_AND_THROW("DepthStencilDesc.DepthFunc must not be COMPARISON_FUNC_UNKNOWN when depth is enabled.");

    auto CheckStencilOpDesc = [&](const StencilOpDesc& OpDesc, const char* FaceName) //
    {
        if (DSSDesc.StencilEnable)
        {
            if (OpDesc.StencilFailOp == STENCIL_OP_UNDEFINED)
                LOG_PSO_ERROR_AND_THROW("DepthStencilDesc.", FaceName, ".StencilFailOp must not be STENCIL_OP_UNDEFINED when stencil is enabled.");
            if (OpDesc.StencilDepthFailOp == STENCIL_OP_UNDEFINED)
                LOG_PSO_ERROR_AND_THROW("DepthStencilDesc.", FaceName, ".StencilDepthFailOp must not be STENCIL_OP_UNDEFINED when stencil is enabled.");
            if (OpDesc.StencilPassOp == STENCIL_OP_UNDEFINED)
                LOG_PSO_ERROR_AND_THROW("DepthStencilDesc.", FaceName, ".StencilPassOp must not be STENCIL_OP_UNDEFINED when stencil is enabled.");
            if (OpDesc.StencilFunc == COMPARISON_FUNC_UNKNOWN)
                LOG_PSO_ERROR_AND_THROW("DepthStencilDesc.", FaceName, ".StencilFunc must not be COMPARISON_FUNC_UNKNOWN when stencil is enabled.");
        }
    };
    CheckStencilOpDesc(DSSDesc.FrontFace, "FrontFace");
    CheckStencilOpDesc(DSSDesc.BackFace, "BackFace");
}